

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O3

void __thiscall license::test::compare_wrong_data::test_method(compare_wrong_data *this)

{
  bool bVar1;
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> local_90;
  HwIdentifier local_88;
  undefined1 local_78;
  undefined8 local_70;
  shared_count sStack_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined1 *local_20;
  char *local_18;
  
  builtin_memcpy(local_90._M_elems,"BBBBBBB",7);
  hw_identifier::HwIdentifier::HwIdentifier(&local_88);
  hw_identifier::HwIdentifier::set_data(&local_88,&local_90);
  local_90._M_elems[4] = '\0';
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2d);
  bVar1 = hw_identifier::HwIdentifier::data_match(&local_88,&local_90);
  local_78 = !bVar1;
  local_70 = 0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_001ab768;
  local_20 = boost::unit_test::lazy_ostream::inst;
  local_18 = "Data shouldn\'t match";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_68);
  hw_identifier::HwIdentifier::~HwIdentifier(&local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compare_wrong_data) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0x42, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	data[4] = 0;
	BOOST_CHECK_MESSAGE(!pc_id.data_match(data), "Data shouldn't match");
}